

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

void icu_63::anon_unknown_17::initStaticTimeZones(void)

{
  SimpleTimeZone *pSVar1;
  code *size;
  SimpleTimeZone *local_e0;
  SimpleTimeZone *local_d0;
  ConstChar16Ptr local_c0;
  UnicodeString local_b8;
  undefined1 local_71;
  SimpleTimeZone *local_70;
  byte local_66;
  byte local_65;
  ConstChar16Ptr local_58;
  UnicodeString local_50;
  undefined1 local_9;
  
  size = timeZone_cleanup;
  ucln_i18n_registerCleanup_63(UCLN_I18N_TIMEZONE,timeZone_cleanup);
  pSVar1 = (SimpleTimeZone *)UMemory::operator_new((UMemory *)0xa0,(size_t)size);
  local_65 = 0;
  local_66 = 0;
  local_d0 = (SimpleTimeZone *)0x0;
  if (pSVar1 != (SimpleTimeZone *)0x0) {
    local_9 = 1;
    ConstChar16Ptr::ConstChar16Ptr(&local_58,L"Etc/Unknown");
    local_65 = 1;
    UnicodeString::UnicodeString(&local_50,'\x01',&local_58,0xb);
    local_66 = 1;
    size = (code *)0x0;
    SimpleTimeZone::SimpleTimeZone(pSVar1,0,&local_50);
    local_d0 = pSVar1;
  }
  local_9 = 0;
  _UNKNOWN_ZONE = (TimeZone *)local_d0;
  if ((local_66 & 1) != 0) {
    UnicodeString::~UnicodeString(&local_50);
  }
  if ((local_65 & 1) != 0) {
    ConstChar16Ptr::~ConstChar16Ptr(&local_58);
  }
  pSVar1 = (SimpleTimeZone *)UMemory::operator_new((UMemory *)0xa0,(size_t)size);
  local_e0 = (SimpleTimeZone *)0x0;
  if (pSVar1 != (SimpleTimeZone *)0x0) {
    local_71 = 1;
    local_70 = pSVar1;
    ConstChar16Ptr::ConstChar16Ptr(&local_c0,L"GMT");
    UnicodeString::UnicodeString(&local_b8,'\x01',&local_c0,3);
    SimpleTimeZone::SimpleTimeZone(pSVar1,0,&local_b8);
    local_e0 = pSVar1;
  }
  local_71 = 0;
  _GMT = (TimeZone *)local_e0;
  if (pSVar1 != (SimpleTimeZone *)0x0) {
    UnicodeString::~UnicodeString(&local_b8);
    ConstChar16Ptr::~ConstChar16Ptr(&local_c0);
  }
  return;
}

Assistant:

void U_CALLCONV initStaticTimeZones() {
    // Initialize _GMT independently of other static data; it should
    // be valid even if we can't load the time zone UDataMemory.
    ucln_i18n_registerCleanup(UCLN_I18N_TIMEZONE, timeZone_cleanup);
    _UNKNOWN_ZONE = new SimpleTimeZone(0, UnicodeString(TRUE, UNKNOWN_ZONE_ID, UNKNOWN_ZONE_ID_LENGTH));
    _GMT = new SimpleTimeZone(0, UnicodeString(TRUE, GMT_ID, GMT_ID_LENGTH));
}